

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

bool image_opcode_is_sample_no_dref(Op op)

{
  bool local_9;
  Op op_local;
  
  if (((((op - OpImageSampleImplicitLod < 2) || (op - OpImageSampleProjImplicitLod < 2)) ||
       (op == OpImageFetch)) || ((op == OpImageRead || (op - OpImageSparseSampleImplicitLod < 2))))
     || ((op - OpImageSparseSampleProjImplicitLod < 2 ||
         ((op == OpImageSparseFetch || (op == OpImageSparseRead)))))) {
    local_9 = true;
  }
  else {
    local_9 = false;
  }
  return local_9;
}

Assistant:

static inline bool image_opcode_is_sample_no_dref(Op op)
{
	switch (op)
	{
	case OpImageSampleExplicitLod:
	case OpImageSampleImplicitLod:
	case OpImageSampleProjExplicitLod:
	case OpImageSampleProjImplicitLod:
	case OpImageFetch:
	case OpImageRead:
	case OpImageSparseSampleExplicitLod:
	case OpImageSparseSampleImplicitLod:
	case OpImageSparseSampleProjExplicitLod:
	case OpImageSparseSampleProjImplicitLod:
	case OpImageSparseFetch:
	case OpImageSparseRead:
		return true;

	default:
		return false;
	}
}